

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  ulong i_00;
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  char cVar4;
  size_t i;
  ulong uVar5;
  int val_1;
  int val;
  char buff [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar5 = 0; uVar5 < s->_M_string_length; uVar5 = uVar5 + 1) {
    pcVar1 = (s->_M_dataplus)._M_p;
    cVar4 = (char)__return_storage_ptr__;
    if ((pcVar1[uVar5] == '%') && (i_00 = uVar5 + 1, i_00 < s->_M_string_length)) {
      if (pcVar1[i_00] == 'u') {
        val = 0;
        bVar2 = from_hex_to_i(s,uVar5 + 2,4,&val);
        if (bVar2) {
          sVar3 = to_utf8(val,buff);
          if (sVar3 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buff);
          }
          uVar5 = uVar5 + 5;
        }
        else {
          std::__cxx11::string::push_back(cVar4);
        }
      }
      else {
        val_1 = 0;
        bVar2 = from_hex_to_i(s,i_00,2,&val_1);
        if (bVar2) {
          std::__cxx11::string::push_back(cVar4);
          uVar5 = uVar5 + 2;
        }
        else {
          std::__cxx11::string::push_back(cVar4);
        }
      }
    }
    else {
      std::__cxx11::string::push_back(cVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}